

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cComputeShaderTests.cpp
# Opt level: O1

bool __thiscall
glcts::anon_unknown_0::ComputeShaderBase::ValidateReadBufferCenteredQuad
          (ComputeShaderBase *this,int width,int height,vec3 *expected)

{
  float *pfVar1;
  byte bVar2;
  int y;
  byte bVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  uint uVar12;
  int iVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  allocator_type local_59;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> fb;
  
  std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::vector
            (&fb,(long)(height * width),(allocator_type *)&data);
  uVar12 = height * width * 4;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&data,(long)(int)uVar12,&local_59);
  glu::CallLogWrapper::glReadPixels
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,0,0,width,height,0x1908
             ,0x1401,data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start);
  if (0 < (int)uVar12) {
    uVar5 = 0;
    do {
      bVar3 = data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start[uVar5 + 1];
      bVar2 = data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start[uVar5 + 2];
      iVar6 = (int)uVar5 >> 2;
      fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
      super__Vector_impl_data._M_start[iVar6].m_data[0] =
           (float)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar5] / 255.0;
      fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
      super__Vector_impl_data._M_start[iVar6].m_data[1] = (float)bVar3 / 255.0;
      fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
      super__Vector_impl_data._M_start[iVar6].m_data[2] = (float)bVar2 / 255.0;
      uVar5 = uVar5 + 4;
    } while (uVar5 < uVar12);
  }
  fVar15 = (float)height * 0.1 + 1.0;
  iVar6 = (int)fVar15;
  iVar4 = (int)(((float)height - (fVar15 + fVar15)) + -1.0);
  if (iVar6 < iVar4) {
    fVar15 = (float)width * 0.1 + 1.0;
    iVar8 = (int)fVar15;
    iVar9 = (int)(((float)width - (fVar15 + fVar15)) + -1.0);
    iVar10 = iVar6 * width + iVar8;
    do {
      lVar11 = (long)iVar9 - (long)iVar8;
      iVar13 = iVar10;
      if (iVar8 < iVar9) {
        do {
          fVar16 = fb.
                   super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar13].m_data[0] - expected->m_data[0]
          ;
          fVar15 = -fVar16;
          if (-fVar16 <= fVar16) {
            fVar15 = fVar16;
          }
          if ((this->g_color_eps).m_data[0] < fVar15) {
LAB_00c29234:
            if (iVar6 < iVar4) goto LAB_00c293b9;
            goto LAB_00c2923d;
          }
          fVar16 = fb.
                   super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar13].m_data[1] - expected->m_data[1]
          ;
          fVar15 = -fVar16;
          if (-fVar16 <= fVar16) {
            fVar15 = fVar16;
          }
          if ((this->g_color_eps).m_data[1] < fVar15) goto LAB_00c29234;
          fVar16 = fb.
                   super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar13].m_data[2] - expected->m_data[2]
          ;
          fVar15 = -fVar16;
          if (-fVar16 <= fVar16) {
            fVar15 = fVar16;
          }
          if ((this->g_color_eps).m_data[2] < fVar15) goto LAB_00c29234;
          iVar13 = iVar13 + 1;
          lVar11 = lVar11 + -1;
        } while (lVar11 != 0);
      }
      iVar6 = iVar6 + 1;
      iVar10 = iVar10 + width;
    } while (iVar6 != iVar4);
  }
LAB_00c2923d:
  iVar6 = width * 2 + 2;
  fVar15 = fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
           _M_impl.super__Vector_impl_data._M_start[iVar6].m_data[0];
  fVar16 = -fVar15;
  if (-fVar15 <= fVar15) {
    fVar16 = fVar15;
  }
  fVar15 = (this->g_color_eps).m_data[0];
  if (fVar15 < fVar16) {
LAB_00c2928f:
    bVar7 = false;
  }
  else {
    fVar16 = fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
             _M_impl.super__Vector_impl_data._M_start[iVar6].m_data[1];
    fVar14 = -fVar16;
    if (-fVar16 <= fVar16) {
      fVar14 = fVar16;
    }
    pfVar1 = (this->g_color_eps).m_data + 1;
    if (*pfVar1 <= fVar14 && fVar14 != *pfVar1) goto LAB_00c2928f;
    fVar16 = fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
             _M_impl.super__Vector_impl_data._M_start[iVar6].m_data[2];
    fVar14 = -fVar16;
    if (-fVar16 <= fVar16) {
      fVar14 = fVar16;
    }
    pfVar1 = (this->g_color_eps).m_data + 2;
    bVar7 = fVar14 < *pfVar1 || fVar14 == *pfVar1;
  }
  iVar6 = width * 3 + -3;
  fVar16 = fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
           _M_impl.super__Vector_impl_data._M_start[iVar6].m_data[0];
  fVar14 = -fVar16;
  if (-fVar16 <= fVar16) {
    fVar14 = fVar16;
  }
  if (fVar15 < fVar14) {
LAB_00c292f4:
    bVar3 = 0;
  }
  else {
    fVar16 = fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
             _M_impl.super__Vector_impl_data._M_start[iVar6].m_data[1];
    fVar14 = -fVar16;
    if (-fVar16 <= fVar16) {
      fVar14 = fVar16;
    }
    pfVar1 = (this->g_color_eps).m_data + 1;
    if (*pfVar1 <= fVar14 && fVar14 != *pfVar1) goto LAB_00c292f4;
    fVar16 = fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
             _M_impl.super__Vector_impl_data._M_start[iVar6].m_data[2];
    fVar14 = -fVar16;
    if (-fVar16 <= fVar16) {
      fVar14 = fVar16;
    }
    pfVar1 = (this->g_color_eps).m_data + 2;
    bVar3 = (fVar14 < *pfVar1 || fVar14 == *pfVar1) & bVar7;
  }
  iVar4 = (height + -3) * width;
  iVar6 = width + -3 + iVar4;
  fVar16 = fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
           _M_impl.super__Vector_impl_data._M_start[iVar6].m_data[0];
  fVar14 = -fVar16;
  if (-fVar16 <= fVar16) {
    fVar14 = fVar16;
  }
  if (fVar15 < fVar14) {
LAB_00c2935a:
    bVar3 = 0;
  }
  else {
    fVar16 = fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
             _M_impl.super__Vector_impl_data._M_start[iVar6].m_data[1];
    fVar14 = -fVar16;
    if (-fVar16 <= fVar16) {
      fVar14 = fVar16;
    }
    pfVar1 = (this->g_color_eps).m_data + 1;
    if (*pfVar1 <= fVar14 && fVar14 != *pfVar1) goto LAB_00c2935a;
    fVar16 = fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
             _M_impl.super__Vector_impl_data._M_start[iVar6].m_data[2];
    fVar14 = -fVar16;
    if (-fVar16 <= fVar16) {
      fVar14 = fVar16;
    }
    pfVar1 = (this->g_color_eps).m_data + 2;
    bVar3 = (fVar14 < *pfVar1 || fVar14 == *pfVar1) & bVar3;
  }
  iVar4 = iVar4 + 2;
  fVar16 = fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
           _M_impl.super__Vector_impl_data._M_start[iVar4].m_data[0];
  fVar14 = -fVar16;
  if (-fVar16 <= fVar16) {
    fVar14 = fVar16;
  }
  if (fVar14 <= fVar15) {
    fVar15 = fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
             _M_impl.super__Vector_impl_data._M_start[iVar4].m_data[1];
    fVar16 = -fVar15;
    if (-fVar15 <= fVar15) {
      fVar16 = fVar15;
    }
    pfVar1 = (this->g_color_eps).m_data + 1;
    if (fVar16 < *pfVar1 || fVar16 == *pfVar1) {
      fVar15 = fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
               ._M_impl.super__Vector_impl_data._M_start[iVar4].m_data[2];
      fVar16 = -fVar15;
      if (-fVar15 <= fVar15) {
        fVar16 = fVar15;
      }
      pfVar1 = (this->g_color_eps).m_data + 2;
      bVar7 = (bool)((fVar16 < *pfVar1 || fVar16 == *pfVar1) & bVar3);
      goto LAB_00c293bb;
    }
  }
LAB_00c293b9:
  bVar7 = false;
LAB_00c293bb:
  if (data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(fb.
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)fb.
                          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)fb.
                          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar7;
}

Assistant:

bool ValidateReadBufferCenteredQuad(int width, int height, const vec3& expected)
	{
		bool				 result = true;
		std::vector<vec3>	fb(width * height);
		std::vector<GLubyte> data(width * height * 4);
		glReadPixels(0, 0, width, height, GL_RGBA, GL_UNSIGNED_BYTE, &data[0]);

		for (int i = 0; i < width * height * 4; i += 4)
		{
			fb[i / 4] = vec3(static_cast<GLfloat>(data[i] / 255.), static_cast<GLfloat>(data[i + 1] / 255.),
							 static_cast<GLfloat>(data[i + 2] / 255.));
		}

		int startx = int((static_cast<float>(width) * 0.1f) + 1);
		int starty = int((static_cast<float>(height) * 0.1f) + 1);
		int endx   = int(static_cast<float>(width) - 2 * ((static_cast<float>(width) * 0.1f) + 1) - 1);
		int endy   = int(static_cast<float>(height) - 2 * ((static_cast<float>(height) * 0.1f) + 1) - 1);

		for (int y = starty; y < endy; ++y)
		{
			for (int x = startx; x < endx; ++x)
			{
				const int idx = y * width + x;
				if (!ColorEqual(fb[idx], expected, g_color_eps))
				{
					return false;
				}
			}
		}

		if (!ColorEqual(fb[2 * width + 2], vec3(0), g_color_eps))
		{
			result = false;
		}
		if (!ColorEqual(fb[2 * width + (width - 3)], vec3(0), g_color_eps))
		{
			result = false;
		}
		if (!ColorEqual(fb[(height - 3) * width + (width - 3)], vec3(0), g_color_eps))
		{
			result = false;
		}
		if (!ColorEqual(fb[(height - 3) * width + 2], vec3(0), g_color_eps))
		{
			result = false;
		}

		return result;
	}